

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxa_demangle.cpp
# Opt level: O1

char * __cxxabiv1::anon_unknown_0::parse_typeid_expr<__cxxabiv1::(anonymous_namespace)::Db>
                 (char *first,char *last,Db *db)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *paVar1;
  pointer psVar2;
  undefined7 uVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *local_b0;
  undefined8 local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  local_a0;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_90;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_70;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_50;
  
  if ((2 < (long)last - (long)first) && (*first == 't')) {
    if (first[1] == 'i') {
      pcVar4 = parse_type<__cxxabiv1::(anonymous_namespace)::Db>(first + 2,last,db);
    }
    else {
      if (first[1] != 'e') {
        return first;
      }
      pcVar4 = parse_expression<__cxxabiv1::(anonymous_namespace)::Db>(first + 2,last,db);
    }
    if ((pcVar4 != first + 2) &&
       (psVar2 = (db->names).
                 super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
       (db->names).
       super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
       ._M_impl.super__Vector_impl_data._M_start != psVar2)) {
      string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
      ::move_full(&local_90,psVar2 + -1);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
      ::replace(&local_90,0,0,"typeid(",7);
      paVar1 = &local_d0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
           *)local_90._M_dataplus._M_p == &local_90.field_2) {
        local_d0.field_2._8_8_ = local_90.field_2._8_8_;
        local_d0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_d0._M_dataplus._M_p = local_90._M_dataplus._M_p;
      }
      local_d0.field_2._M_allocated_capacity._1_7_ = local_90.field_2._M_allocated_capacity._1_7_;
      local_d0._M_string_length = local_90._M_string_length;
      local_90._M_string_length = 0;
      local_90.field_2._M_local_buf[0] = '\0';
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
      ::append(&local_d0,")");
      uVar3 = local_d0.field_2._M_allocated_capacity._1_7_;
      local_70._M_string_length = local_d0._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
           *)local_d0._M_dataplus._M_p == paVar1) {
        local_a0._8_8_ = local_d0.field_2._8_8_;
        local_b0 = &local_a0;
      }
      else {
        local_b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
                    *)local_d0._M_dataplus._M_p;
      }
      local_d0._M_string_length = 0;
      local_d0.field_2._M_allocated_capacity =
           (ulong)(uint7)local_d0.field_2._M_allocated_capacity._1_7_ << 8;
      if (local_b0 == &local_a0) {
        local_70.field_2._8_8_ = local_a0._8_8_;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      }
      else {
        local_70._M_dataplus._M_p = (pointer)local_b0;
      }
      local_a8 = 0;
      local_a0._M_allocated_capacity = (ulong)(uint7)uVar3 << 8;
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      psVar2 = (db->names).
               super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_d0._M_dataplus._M_p = (pointer)paVar1;
      local_b0 = &local_a0;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
      ::operator=(&psVar2[-1].first,&local_70);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
      ::operator=(&psVar2[-1].second,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        free(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        free(local_70._M_dataplus._M_p);
      }
      if (local_b0 != &local_a0) {
        free(local_b0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        free(local_d0._M_dataplus._M_p);
      }
      first = pcVar4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        free(local_90._M_dataplus._M_p);
      }
    }
  }
  return first;
}

Assistant:

const char*
parse_typeid_expr(const char* first, const char* last, C& db)
{
    if (last - first >= 3 && first[0] == 't' && (first[1] == 'e' || first[1] == 'i'))
    {
        const char* t;
        if (first[1] == 'e')
            t = parse_expression(first+2, last, db);
        else
            t = parse_type(first+2, last, db);
        if (t != first+2)
        {
            if (db.names.empty())
                return first;
            db.names.back() = "typeid(" + db.names.back().move_full() + ")";
            first = t;
        }
    }
    return first;
}